

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

double units::getNumberBlock(string *ustring,size_t *index)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  byte bVar5;
  double dVar6;
  size_t ival;
  size_t ind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> substr;
  size_t local_60;
  double local_58;
  size_t local_50;
  string local_48;
  double local_28;
  
  if (*(ustring->_M_dataplus)._M_p == '(') {
    local_60 = 1;
    bVar2 = segmentcheck(ustring,')',&local_60);
    local_58 = NAN;
    if (bVar2) {
      if (local_60 == 2) {
        *index = 2;
        dVar6 = 1.0;
        bVar2 = false;
      }
      else {
        if (local_60 - 1 < 2) {
          bVar5 = 2;
          bVar2 = false;
        }
        else {
          lVar3 = 0;
          bVar2 = false;
          do {
            bVar1 = (ustring->_M_dataplus)._M_p[lVar3 + 1];
            bVar5 = 4;
            if (9 < (byte)(bVar1 - 0x30)) {
              bVar5 = 1;
              uVar4 = bVar1 - 0x28;
              if (uVar4 < 0x3e) {
                if ((0x40000000000087U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
                  if ((0x2000000000000060U >> ((ulong)uVar4 & 0x3f) & 1) == 0) goto LAB_001654c1;
                }
                else {
                  bVar2 = true;
                }
                bVar5 = 0;
              }
            }
LAB_001654c1:
            if ((bVar5 & 3) != 0) goto LAB_001654df;
            lVar3 = lVar3 + 1;
          } while (local_60 - 2 != lVar3);
          bVar5 = 2;
        }
LAB_001654df:
        local_58 = NAN;
        if (bVar5 == 2) {
          std::__cxx11::string::substr((ulong)&local_48,(ulong)ustring);
          local_50 = 0;
          if (bVar2) {
            local_58 = generateLeadingNumber(&local_48,&local_50);
          }
          else {
            local_58 = getDoubleFromString(&local_48,&local_50);
          }
          bVar5 = local_50 < local_48._M_string_length;
          if (!(bool)bVar5) {
            *index = local_60;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          }
        }
        dVar6 = NAN;
        bVar2 = bVar5 == 0;
      }
    }
    else {
      bVar2 = false;
      dVar6 = NAN;
    }
    if (!bVar2) {
      return dVar6;
    }
  }
  else {
    local_58 = getDoubleFromString(ustring,index);
  }
  if (((!NAN(local_58)) && (*index < ustring->_M_string_length)) &&
     ((ustring->_M_dataplus)._M_p[*index] == '^')) {
    local_60 = 0;
    std::__cxx11::string::substr((ulong)&local_48,(ulong)ustring);
    dVar6 = getNumberBlock(&local_48,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      local_28 = dVar6;
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      dVar6 = local_28;
    }
    if (NAN(dVar6)) {
      *index = 0;
      local_58 = NAN;
    }
    else {
      *index = local_60 + *index + 1;
      local_58 = pow(local_58,dVar6);
    }
  }
  return local_58;
}

Assistant:

static double getNumberBlock(const std::string& ustring, size_t& index) noexcept
{
    double val{constants::invalid_conversion};
    if (ustring.front() == '(') {
        size_t ival{1};
        if (segmentcheck(ustring, ')', ival)) {
            if (ival == 2) {
                index = ival;
                return 1.0;
            }
            bool hasOp = false;
            for (size_t ii = 1; ii < ival - 1; ++ii) {
                auto c = ustring[ii];
                if (c >= '0' && c <= '9') {
                    continue;
                }
                switch (c) {
                    case '-':
                    case '.':
                    case 'e':
                        break;
                    case '*':
                    case '/':
                    case '^':
                    case '(':
                    case ')':
                        hasOp = true;
                        break;
                    default:
                        return constants::invalid_conversion;
                }
            }
            auto substr = ustring.substr(1, ival - 2);
            size_t ind{0};
            if (hasOp) {
                val = generateLeadingNumber(substr, ind);
            } else {
                val = getDoubleFromString(substr, &ind);
            }
            if (ind < substr.size()) {
                return constants::invalid_conversion;
            }
            index = ival;
        } else {
            return constants::invalid_conversion;
        }
    } else {
        val = getDoubleFromString(ustring, &index);
    }
    if (!std::isnan(val) && index < ustring.size()) {
        if (ustring[index] == '^') {
            size_t nindex{0};
            double pval = getNumberBlock(ustring.substr(index + 1), nindex);
            if (!std::isnan(pval)) {
                index += nindex + 1;
                return std::pow(val, pval);
            }
            index = 0;
            return constants::invalid_conversion;
        }
    }
    return val;
}